

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O1

Error * libsbox::run_together
                  (Error *__return_storage_ptr__,
                  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *tasks,
                  string *socket_path)

{
  pointer ppTVar1;
  Task *this;
  long *plVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Ch *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ssize_t sVar6;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar7;
  char *pcVar8;
  Type pGVar9;
  pointer ppTVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  Ch *pCVar11;
  size_t __n;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *__range1;
  ulong uVar12;
  fd_t socket_fd;
  string res;
  Document document;
  string message;
  char buf [1024];
  sockaddr_un addr;
  int local_5e4;
  string local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b8;
  undefined8 local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  Data local_598;
  long local_588 [8];
  ParseErrorCode local_548;
  undefined8 local_540;
  long *local_538;
  long local_530;
  long local_528 [2];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_518;
  Stack<rapidjson::CrtAllocator> local_4d8;
  string local_4a8 [32];
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  local_518.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_4d8;
  local_4d8.stackEnd_ = (char *)0x0;
  local_4d8.stack_ = (char *)0x0;
  local_4d8.stackTop_ = (char *)0x0;
  local_4d8.allocator_ = (CrtAllocator *)0x0;
  local_4d8.ownAllocator_ = (CrtAllocator *)0x0;
  local_4d8.initialCapacity_ = 0x100;
  local_518.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_518.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_518.level_stack_.stack_ = (char *)0x0;
  local_518.level_stack_.stackTop_ = (char *)0x0;
  local_518.level_stack_.stackEnd_ = (char *)0x0;
  local_518.level_stack_.initialCapacity_ = 0x200;
  local_518.maxDecimalPlaces_ = 0x144;
  local_518.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_518);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_518,"tasks",5,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(&local_518);
  ppTVar10 = (tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar1 = (tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar10 != ppTVar1) {
    do {
      Task::
      serialize_request<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                (*ppTVar10,&local_518);
      ppTVar10 = ppTVar10 + 1;
    } while (ppTVar10 != ppTVar1);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(&local_518,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_518,0);
  __s = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_4d8
                  );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,__s,(allocator<char> *)local_4a8);
  local_5e4 = socket(1,1,0);
  if (local_5e4 < 0) {
    format_abi_cxx11_(local_4a8,"Cannot create socket: %m");
    Error::Error(__return_storage_ptr__,local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
      operator_delete(local_4a8[0]._M_dataplus._M_p,local_4a8[0].field_2._M_allocated_capacity + 1);
    }
    goto LAB_0010cb42;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0014d6b8;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&local_5e4;
  local_a8.sa_data[6] = '\0';
  local_a8.sa_data[7] = '\0';
  local_a8.sa_data[8] = '\0';
  local_a8.sa_data[9] = '\0';
  local_a8.sa_data[10] = '\0';
  local_a8.sa_data[0xb] = '\0';
  local_a8.sa_data[0xc] = '\0';
  local_a8.sa_data[0xd] = '\0';
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4a = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.sa_family = 1;
  local_a8.sa_data[0] = '\0';
  local_a8.sa_data[1] = '\0';
  local_a8.sa_data[2] = '\0';
  local_a8.sa_data[3] = '\0';
  local_a8.sa_data[4] = '\0';
  local_a8.sa_data[5] = '\0';
  __n = 0x6b;
  if (socket_path->_M_string_length < 0x6b) {
    __n = socket_path->_M_string_length;
  }
  strncpy(local_a8.sa_data,(socket_path->_M_dataplus)._M_p,__n);
  iVar4 = connect(local_5e4,&local_a8,0x6e);
  if (iVar4 == 0) {
    sVar6 = send(local_5e4,local_538,local_530 + 1,0);
    if ((-1 < (int)(uint)sVar6) && ((ulong)((uint)sVar6 & 0x7fffffff) == local_530 + 1U)) {
      local_5b8 = &local_5a8;
      local_5b0 = 0;
      local_5a8._M_local_buf[0] = '\0';
      while( true ) {
        sVar6 = recv(local_5e4,local_4a8,0x3ff,0);
        uVar5 = (uint)sVar6;
        if ((int)uVar5 < 0) break;
        if (uVar5 == 0) {
          if ((run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
               ::response_validator == '\0') &&
             (iVar4 = __cxa_guard_acquire(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                           ::response_validator), iVar4 != 0)) {
            SchemaValidator::SchemaValidator(&run_together::response_validator,response_schema_data)
            ;
            __cxa_atexit(SchemaValidator::~SchemaValidator,&run_together::response_validator,
                         &__dso_handle);
            __cxa_guard_release(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                 ::response_validator);
          }
          SchemaValidator::get_error_abi_cxx11_
                    ((string *)&local_598.s,&run_together::response_validator);
          if (local_598.n.i64 != (Number)local_588) {
            operator_delete((void *)local_598.n,local_588[0] + 1);
          }
          if (local_598.s.str != (Ch *)0x0) {
            SchemaValidator::get_error_abi_cxx11_
                      ((string *)&local_598.s,&run_together::response_validator);
            Error::Error(__return_storage_ptr__,(string *)&local_598.s);
            if (local_598.n.i64 == (Number)local_588) goto LAB_0010ce33;
            goto LAB_0010cc3f;
          }
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)&local_598.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,
                            0x400,(CrtAllocator *)0x0);
          local_5e0._M_dataplus._M_p = (pointer)local_5b8;
          local_5e0._M_string_length = (size_type)local_5b8;
          pGVar7 = rapidjson::
                   GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                   ::
                   ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                             ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                               *)&local_598.s,
                              (GenericStringStream<rapidjson::UTF8<char>_> *)&local_5e0);
          if ((pGVar7->parseResult_).code_ == kParseErrorNone) {
            bVar3 = SchemaValidator::validate
                              (&run_together::response_validator,(Document *)&local_598.s);
            if (!bVar3) {
              SchemaValidator::get_error_abi_cxx11_(&local_5e0,&run_together::response_validator);
              Error::Error(__return_storage_ptr__,&local_5e0);
              goto LAB_0010ce0e;
            }
            bVar3 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_598.s,"error");
            if ((bVar3) &&
               (pGVar9 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)&local_598.s,"error"),
               (undefined1  [16])
               ((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x400000000000000) !=
               (undefined1  [16])0x0)) {
              pGVar9 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)&local_598.s,"error");
              pCVar11 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetString(pGVar9);
              format_abi_cxx11_(&local_5e0,"[remote] %s",pCVar11);
              Error::Error(__return_storage_ptr__,&local_5e0);
              goto LAB_0010ce0e;
            }
            pGVar9 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)&local_598.s,"tasks");
            if ((pGVar9->data_).f.flags != 4) {
              __assert_fail("IsArray()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                            ,0x711,
                            "Array rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                           );
            }
            if ((long)(tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3 ==
                (ulong)(pGVar9->data_).s.length) {
              ppTVar10 = (tasks->
                         super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              if ((tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish == ppTVar10) goto LAB_0010cdcf;
              local_5c0 = &(__return_storage_ptr__->error_).field_2;
              uVar12 = 0;
              goto LAB_0010cd5d;
            }
            local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5e0,
                       "Response JSON object \'tasks\' array size is not equal to tasks count","");
            Error::Error(__return_storage_ptr__,&local_5e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p == &local_5e0.field_2) goto LAB_0010ce29;
          }
          else {
            pcVar8 = rapidjson::GetParseError_En(local_548);
            format_abi_cxx11_(&local_5e0,"Cannot parse response (offset %zi): %s",local_540,pcVar8);
            Error::Error(__return_storage_ptr__,&local_5e0);
LAB_0010ce0e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._M_dataplus._M_p == &local_5e0.field_2) goto LAB_0010ce29;
          }
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
          goto LAB_0010ce29;
        }
        *(undefined1 *)((long)&local_4a8[0]._M_dataplus._M_p + (ulong)(uVar5 & 0x7fffffff)) = 0;
        std::__cxx11::string::append((char *)&local_5b8);
      }
      format_abi_cxx11_((string *)&local_598.s,"Cannot receive response: %m");
      Error::Error(__return_storage_ptr__,(string *)&local_598.s);
      if (local_598.n.i64 != (Number)local_588) {
LAB_0010cc3f:
        operator_delete((void *)local_598.n,local_588[0] + 1);
      }
      goto LAB_0010ce33;
    }
    format_abi_cxx11_(local_4a8,"Cannot send request: %m");
    Error::Error(__return_storage_ptr__,local_4a8);
  }
  else {
    format_abi_cxx11_(local_4a8,"Cannot connect to socket: %m");
    Error::Error(__return_storage_ptr__,local_4a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
LAB_0010cb32:
    operator_delete(local_4a8[0]._M_dataplus._M_p,local_4a8[0].field_2._0_8_ + 1);
  }
  goto LAB_0010cb3a;
  while( true ) {
    plVar2 = (long *)(__return_storage_ptr__->error_)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_5c0) {
      operator_delete(plVar2,local_5c0->_M_allocated_capacity + 1);
    }
    uVar12 = uVar12 + 1;
    ppTVar10 = (tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(tasks->super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10 >> 3) <= uVar12)
    break;
LAB_0010cd5d:
    this = ppTVar10[uVar12];
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)&local_598.s,"tasks");
    value = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[](pGVar9,(SizeType)uVar12);
    Task::
    deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (__return_storage_ptr__,this,value);
    bVar3 = Error::operator_cast_to_bool(__return_storage_ptr__);
    if (bVar3) goto LAB_0010ce29;
  }
LAB_0010cdcf:
  (__return_storage_ptr__->error_)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->error_)._M_string_length = 0;
  (__return_storage_ptr__->error_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->error_).field_2 + 8) = 0;
  (__return_storage_ptr__->error_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_).field_2;
  (__return_storage_ptr__->error_)._M_string_length = 0;
  (__return_storage_ptr__->error_).field_2._M_local_buf[0] = '\0';
LAB_0010ce29:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_598.s);
LAB_0010ce33:
  if (local_5b8 != &local_5a8) {
    local_4a8[0].field_2._0_8_ =
         CONCAT71(local_5a8._M_allocated_capacity._1_7_,local_5a8._M_local_buf[0]);
    local_4a8[0]._M_dataplus._M_p = (pointer)local_5b8;
    goto LAB_0010cb32;
  }
LAB_0010cb3a:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_0010cb42:
  if (local_538 != local_528) {
    operator_delete(local_538,local_528[0] + 1);
  }
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_518.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_4d8);
  return __return_storage_ptr__;
}

Assistant:

Error libsbox::run_together(const std::vector<Task *> &tasks, const std::string &socket_path) {
    rapidjson::StringBuffer buffer;
    rapidjson::Writer<rapidjson::StringBuffer> writer(buffer);
    writer.StartObject();
    writer.Key("tasks");
    writer.StartArray();
    for (auto task : tasks) {
        task->serialize_request(writer);
    }
    writer.EndArray();
    writer.EndObject();

    std::string message = buffer.GetString();

    fd_t socket_fd = socket(AF_UNIX, SOCK_STREAM, 0);
    if (socket_fd < 0) {
        return Error(format("Cannot create socket: %m"));
    }

    std::shared_ptr<fd_t> ptr(&socket_fd, [](const fd_t *fd) { close(*fd); });

    sockaddr_un addr{};
    addr.sun_family = AF_UNIX;
    strncpy(addr.sun_path, socket_path.c_str(), std::min(sizeof(addr.sun_path) - 1, socket_path.size()));

    int status = connect(socket_fd, reinterpret_cast<const struct sockaddr *>(&addr), sizeof(struct sockaddr_un));
    if (status != 0) {
        return Error(format("Cannot connect to socket: %m"));
    }

    int cnt = send(socket_fd, message.c_str(), message.size() + 1, 0);
    if (cnt < 0 || static_cast<size_t>(cnt) != message.size() + 1) {
        return Error(format("Cannot send request: %m"));
    }

    std::string res;
    char buf[1024];
    while (true) {
        cnt = recv(socket_fd, buf, 1023, 0);
        if (cnt < 0) {
            return Error(format("Cannot receive response: %m"));
        }
        if (cnt == 0) {
            break;
        }
        buf[cnt] = 0;
        res += buf;
    }

    static SchemaValidator response_validator(response_schema_data);
    if (!response_validator.get_error().empty()) {
        return Error(response_validator.get_error());
    }

    rapidjson::Document document;
    if (document.Parse(res.c_str()).HasParseError()) {
        return Error(
            format(
                "Cannot parse response (offset %zi): %s",
                document.GetErrorOffset(),
                rapidjson::GetParseError_En(document.GetParseError())
            )
        );
    }

    if (!response_validator.validate(document)) {
        return Error(response_validator.get_error());
    }

    if (document.HasMember("error") && document["error"].IsString()) {
        return Error(format("[remote] %s", document["error"].GetString()));
    }

    if (document["tasks"].GetArray().Size() != tasks.size()) {
        return Error("Response JSON object 'tasks' array size is not equal to tasks count");
    }

    for (size_t i = 0; i < tasks.size(); ++i) {
        auto error = tasks[i]->deserialize_response(document["tasks"][i]);
        if (error) {
            return error;
        }
    }

    return Error();
}